

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

char * Assimp::Blender::GetTextureTypeDisplayString(Type t)

{
  char *pcStack_10;
  Type t_local;
  
  switch(t) {
  case Type_CLOUDS:
    pcStack_10 = "Clouds";
    break;
  case Type_WOOD:
    pcStack_10 = "Wood";
    break;
  case Type_MARBLE:
    pcStack_10 = "Marble";
    break;
  case Type_MAGIC:
    pcStack_10 = "Magic";
    break;
  case Type_BLEND:
    pcStack_10 = "Blend";
    break;
  case Type_STUCCI:
    pcStack_10 = "Stucci";
    break;
  case Type_NOISE:
    pcStack_10 = "Noise";
    break;
  case Type_IMAGE:
    pcStack_10 = "Image";
    break;
  case Type_PLUGIN:
    pcStack_10 = "Plugin";
    break;
  case Type_ENVMAP:
    pcStack_10 = "EnvMap";
    break;
  case Type_MUSGRAVE:
    pcStack_10 = "Musgrave";
    break;
  case Type_VORONOI:
    pcStack_10 = "Voronoi";
    break;
  case Type_DISTNOISE:
    pcStack_10 = "DistortedNoise";
    break;
  default:
    pcStack_10 = "<Unknown>";
  }
  return pcStack_10;
}

Assistant:

inline const char* GetTextureTypeDisplayString(Tex::Type t)
{
    switch (t)  {
    case Tex::Type_CLOUDS       :  return  "Clouds";
    case Tex::Type_WOOD         :  return  "Wood";
    case Tex::Type_MARBLE       :  return  "Marble";
    case Tex::Type_MAGIC        :  return  "Magic";
    case Tex::Type_BLEND        :  return  "Blend";
    case Tex::Type_STUCCI       :  return  "Stucci";
    case Tex::Type_NOISE        :  return  "Noise";
    case Tex::Type_PLUGIN       :  return  "Plugin";
    case Tex::Type_MUSGRAVE     :  return  "Musgrave";
    case Tex::Type_VORONOI      :  return  "Voronoi";
    case Tex::Type_DISTNOISE    :  return  "DistortedNoise";
    case Tex::Type_ENVMAP       :  return  "EnvMap";
    case Tex::Type_IMAGE        :  return  "Image";
    default:
        break;
    }
    return "<Unknown>";
}